

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.hh
# Opt level: O1

state_status_t __thiscall
tchecker::refzg::standard_semantics_t<(tchecker::refzg::empty_sync_zone_policy_t)1>::final
          (standard_semantics_t<(tchecker::refzg::empty_sync_zone_policy_t)1> *this,db_t *rdbm,
          reference_clock_variables_t *r,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *delay_allowed,
          clock_constraint_container_t *invariant,integer_t spread)

{
  bool bVar1;
  status_t sVar2;
  state_status_t sVar3;
  
  refdbm::universal_positive(rdbm,r);
  sVar2 = refdbm::bound_spread(rdbm,r,spread);
  if (sVar2 == EMPTY) {
    sVar3 = 0x800;
  }
  else {
    sVar2 = refdbm::constrain(rdbm,r,invariant);
    if (sVar2 == EMPTY) {
      sVar3 = 0x100;
    }
    else {
      bVar1 = refdbm::is_synchronizable(rdbm,r);
      sVar3 = 0x2000;
      if (bVar1) {
        sVar3 = 1;
      }
    }
  }
  return sVar3;
}

Assistant:

virtual tchecker::state_status_t final(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r,
                                         [[maybe_unused]] boost::dynamic_bitset<> const & delay_allowed,
                                         tchecker::clock_constraint_container_t const & invariant, tchecker::integer_t spread)
  {
    tchecker::refdbm::universal_positive(rdbm, r);

    if (tchecker::refdbm::bound_spread(rdbm, r, spread) == tchecker::dbm::EMPTY)
      return tchecker::STATE_CLOCKS_EMPTY_SPREAD;

    if (tchecker::refdbm::constrain(rdbm, r, invariant) == tchecker::dbm::EMPTY)
      return tchecker::STATE_CLOCKS_TGT_INVARIANT_VIOLATED;

    if (EMPTY_ZONE_POLICY == tchecker::refzg::empty_sync_zone_policy_t::INVALID)
      if (!tchecker::refdbm::is_synchronizable(rdbm, r))
        return tchecker::STATE_ZONE_EMPTY_SYNC;

    return tchecker::STATE_OK;
  }